

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O1

int pt_insn_at_skl014(pt_event *ev,pt_insn *insn,pt_insn_ext *iext,pt_config *config)

{
  int iVar1;
  
  if ((ev->field_0x4 & 1) != 0) {
    if (((insn->iclass == ptic_jump) || (insn->iclass == ptic_call)) &&
       ((iext->variant).branch.is_direct != '\0')) {
      iVar1 = pt_filter_addr_check
                        (&config->addr_filter,
                         (long)(iext->variant).branch.displacement + (ulong)insn->size + insn->ip);
      if (iVar1 < 1) {
        return iVar1 + (uint)(iVar1 == 0);
      }
    }
  }
  return 0;
}

Assistant:

static int pt_insn_at_skl014(const struct pt_event *ev,
			     const struct pt_insn *insn,
			     const struct pt_insn_ext *iext,
			     const struct pt_config *config)
{
	uint64_t ip;
	int status;

	if (!ev || !insn || !iext || !config)
		return -pte_internal;

	if (!ev->ip_suppressed)
		return 0;

	switch (insn->iclass) {
	case ptic_call:
	case ptic_jump:
		/* The erratum only applies to unconditional direct branches. */
		if (!iext->variant.branch.is_direct)
			break;

		/* Check the filter against the branch target. */
		ip = insn->ip;
		ip += insn->size;
		ip += (uint64_t) (int64_t) iext->variant.branch.displacement;

		status = pt_filter_addr_check(&config->addr_filter, ip);
		if (status <= 0) {
			if (status < 0)
				return status;

			return 1;
		}
		break;

	default:
		break;
	}

	return 0;
}